

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Statements.cpp
# Opt level: O1

bool __thiscall psy::C::Parser::parseExpressionStatement(Parser *this,StatementSyntax **stmt)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  ExpressionStatementSyntax *pEVar3;
  IndexType IVar4;
  ExpressionSyntax *expr;
  ExpressionSyntax *local_20;
  
  pSVar2 = peek(this,1);
  if (pSVar2->syntaxK_ == SemicolonToken) {
    pEVar3 = makeNode<psy::C::ExpressionStatementSyntax>(this);
    *stmt = &pEVar3->super_StatementSyntax;
    IVar4 = consume(this);
    pEVar3->semicolonTkIdx_ = IVar4;
    bVar1 = true;
  }
  else {
    local_20 = (ExpressionSyntax *)0x0;
    bVar1 = parseExpression(this,&local_20);
    if (bVar1) {
      pEVar3 = makeNode<psy::C::ExpressionStatementSyntax>(this);
      *stmt = &pEVar3->super_StatementSyntax;
      pEVar3->expr_ = local_20;
      bVar1 = matchOrSkipTo(this,SemicolonToken,&pEVar3->semicolonTkIdx_);
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool Parser::parseExpressionStatement(StatementSyntax*& stmt)
{
    DBG_THIS_RULE();

    if (peek().kind() == SyntaxKind::SemicolonToken) {
        auto exprStmt = makeNode<ExpressionStatementSyntax>();
        stmt = exprStmt;
        exprStmt->semicolonTkIdx_ = consume();
        return true;
    }

    ExpressionSyntax* expr = nullptr;
    if (!parseExpression(expr))
        return false;

    auto exprStmt = makeNode<ExpressionStatementSyntax>();
    stmt = exprStmt;
    exprStmt->expr_ = expr;

    return matchOrSkipTo(SyntaxKind::SemicolonToken, &exprStmt->semicolonTkIdx_);
}